

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O2

bool __thiscall cmArchiveWrite::AddFile(cmArchiveWrite *this,char *file,size_t skip,char *prefix)

{
  Entry entry;
  bool bVar1;
  int iVar2;
  mode_t mVar3;
  size_t sVar4;
  ostream *poVar5;
  archive_entry *entry_00;
  time_t t;
  char *pcVar6;
  size_t size;
  string *psVar7;
  Entry e;
  time_t epochTime;
  string source_date_epoch;
  string dest;
  cmLocaleRAII localeRAII;
  time_t now;
  uint auStack_190 [88];
  
  psVar7 = &this->Error;
  std::__cxx11::string::assign((char *)psVar7);
  sVar4 = strlen(file);
  if (sVar4 <= skip) {
    return true;
  }
  cmLocaleRAII::cmLocaleRAII(&localeRAII);
  pcVar6 = "";
  if (prefix != (char *)0x0) {
    pcVar6 = prefix;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&dest,pcVar6,(allocator<char> *)&now)
  ;
  std::__cxx11::string::append((char *)&dest);
  if (this->Verbose == true) {
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&dest);
    std::operator<<(poVar5,"\n");
  }
  entry_00 = archive_entry_new();
  e.Object = entry_00;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source_date_epoch,file,(allocator<char> *)&epochTime);
  cmsys::Encoding::ToWide((wstring *)&now,&source_date_epoch);
  archive_entry_copy_sourcepath_w(entry_00,(wchar_t *)now);
  std::__cxx11::wstring::~wstring((wstring *)&now);
  std::__cxx11::string::~string((string *)&source_date_epoch);
  entry = e;
  cmsys::Encoding::ToWide((wstring *)&now,&dest);
  archive_entry_copy_pathname_w(entry.Object,(wchar_t *)now);
  std::__cxx11::wstring::~wstring((wstring *)&now);
  iVar2 = archive_read_disk_entry_from_file(this->Disk,e.Object,-1,(stat *)0x0);
  if (iVar2 == 0) {
    if ((this->MTime)._M_string_length == 0) {
      source_date_epoch._M_dataplus._M_p = (pointer)&source_date_epoch.field_2;
      source_date_epoch._M_string_length = 0;
      source_date_epoch.field_2._M_local_buf[0] = '\0';
      cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",&source_date_epoch);
      if (source_date_epoch._M_string_length != 0) {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&now,(string *)&source_date_epoch,_S_in);
        std::istream::_M_extract<long>(&now);
        if ((*(uint *)((long)auStack_190 + *(long *)(now + -0x18)) & 7) == 2) {
          archive_entry_set_mtime(e.Object,epochTime,0);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)&now);
      }
      std::__cxx11::string::~string((string *)&source_date_epoch);
LAB_001dd4f4:
      if (((this->Uid).IsValueSet == true) && ((this->Gid).IsValueSet == true)) {
        archive_entry_set_uid(e.Object,(long)(this->Uid).Value);
        archive_entry_set_gid(e.Object,(long)(this->Gid).Value);
      }
      if (((this->Uname)._M_string_length != 0) && ((this->Gname)._M_string_length != 0)) {
        archive_entry_set_uname(e.Object,(this->Uname)._M_dataplus._M_p);
        archive_entry_set_gname(e.Object,(this->Gname)._M_dataplus._M_p);
      }
      if ((this->Permissions).IsValueSet == true) {
        archive_entry_set_perm(e.Object,(this->Permissions).Value);
      }
      if ((this->PermissionsMask).IsValueSet == true) {
        mVar3 = archive_entry_perm(e.Object);
        archive_entry_set_perm(e.Object,mVar3 & (this->PermissionsMask).Value);
      }
      archive_entry_acl_clear(e.Object);
      archive_entry_xattr_clear(e.Object);
      archive_entry_set_fflags(e.Object,0,0);
      bVar1 = std::operator==(&this->Format,"pax");
      if ((bVar1) || (bVar1 = std::operator==(&this->Format,"paxr"), bVar1)) {
        archive_entry_sparse_clear(e.Object);
      }
      iVar2 = archive_write_header(this->Archive,e.Object);
      if (iVar2 == 0) {
        pcVar6 = archive_entry_symlink(e.Object);
        bVar1 = true;
        if ((pcVar6 == (char *)0x0) && (size = archive_entry_size(e.Object), size != 0)) {
          bVar1 = AddData(this,file,size);
        }
        goto LAB_001dd634;
      }
      std::__cxx11::string::assign((char *)psVar7);
      cm_archive_error_string_abi_cxx11_((string *)&now,this->Archive);
      std::__cxx11::string::append((string *)psVar7);
      goto LAB_001dd628;
    }
    time(&now);
    t = cm_get_date(now,(this->MTime)._M_dataplus._M_p);
    if (t != -1) {
      archive_entry_set_mtime(e.Object,t,0);
      goto LAB_001dd4f4;
    }
    std::__cxx11::string::assign((char *)psVar7);
    std::__cxx11::string::append((string *)psVar7);
    std::__cxx11::string::append((char *)psVar7);
  }
  else {
    std::__cxx11::string::assign((char *)psVar7);
    std::__cxx11::string::append((char *)psVar7);
    std::__cxx11::string::append((char *)psVar7);
    cm_archive_error_string_abi_cxx11_((string *)&now,this->Disk);
    std::__cxx11::string::append((string *)psVar7);
LAB_001dd628:
    std::__cxx11::string::~string((string *)&now);
  }
  bVar1 = false;
LAB_001dd634:
  Entry::~Entry(&e);
  std::__cxx11::string::~string((string *)&dest);
  cmLocaleRAII::~cmLocaleRAII(&localeRAII);
  return bVar1;
}

Assistant:

bool cmArchiveWrite::AddFile(const char* file, size_t skip, const char* prefix)
{
  this->Error = "";
  // Skip the file if we have no name for it.  This may happen on a
  // top-level directory, which does not need to be included anyway.
  if (skip >= strlen(file)) {
    return true;
  }
  const char* out = file + skip;

  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);

  // Meta-data.
  std::string dest = prefix ? prefix : "";
  dest += out;
  if (this->Verbose) {
    std::cout << dest << "\n";
  }
  Entry e;
  cm_archive_entry_copy_sourcepath(e, file);
  cm_archive_entry_copy_pathname(e, dest);
  if (archive_read_disk_entry_from_file(this->Disk, e, -1, nullptr) !=
      ARCHIVE_OK) {
    this->Error = "Unable to read from file '";
    this->Error += file;
    this->Error += "': ";
    this->Error += cm_archive_error_string(this->Disk);
    return false;
  }
  if (!this->MTime.empty()) {
    time_t now;
    time(&now);
    time_t t = cm_get_date(now, this->MTime.c_str());
    if (t == -1) {
      this->Error = "unable to parse mtime '";
      this->Error += this->MTime;
      this->Error += "'";
      return false;
    }
    archive_entry_set_mtime(e, t, 0);
  } else {
    std::string source_date_epoch;
    cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
    if (!source_date_epoch.empty()) {
      std::istringstream iss(source_date_epoch);
      time_t epochTime;
      iss >> epochTime;
      if (iss.eof() && !iss.fail()) {
        archive_entry_set_mtime(e, epochTime, 0);
      }
    }
  }

  // manages the uid/guid of the entry (if any)
  if (this->Uid.IsSet() && this->Gid.IsSet()) {
    archive_entry_set_uid(e, this->Uid.Get());
    archive_entry_set_gid(e, this->Gid.Get());
  }

  if (!this->Uname.empty() && !this->Gname.empty()) {
    archive_entry_set_uname(e, this->Uname.c_str());
    archive_entry_set_gname(e, this->Gname.c_str());
  }

  // manages the permissions
  if (this->Permissions.IsSet()) {
    archive_entry_set_perm(e, this->Permissions.Get());
  }

  if (this->PermissionsMask.IsSet()) {
    int perm = archive_entry_perm(e);
    archive_entry_set_perm(e, perm & this->PermissionsMask.Get());
  }

  // Clear acl and xattr fields not useful for distribution.
  archive_entry_acl_clear(e);
  archive_entry_xattr_clear(e);
  archive_entry_set_fflags(e, 0, 0);

  if (this->Format == "pax" || this->Format == "paxr") {
    // Sparse files are a GNU tar extension.
    // Do not use them in standard tar files.
    archive_entry_sparse_clear(e);
  }

  if (archive_write_header(this->Archive, e) != ARCHIVE_OK) {
    this->Error = "archive_write_header: ";
    this->Error += cm_archive_error_string(this->Archive);
    return false;
  }

  // do not copy content of symlink
  if (!archive_entry_symlink(e)) {
    // Content.
    if (size_t size = static_cast<size_t>(archive_entry_size(e))) {
      return this->AddData(file, size);
    }
  }
  return true;
}